

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall
benchmark::internal::BenchmarkImp::Ranges
          (BenchmarkImp *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  allocator_type *paVar4;
  reference pvVar5;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  size_t j_1;
  size_t j;
  vector<int,_std::allocator<int>_> tmp;
  int i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ctr;
  size_t i;
  int total;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  arglists;
  allocator_type *in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined1 *puVar6;
  undefined8 in_stack_ffffffffffffff68;
  ulong uVar7;
  ulong __n;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  allocator_type *__n_00;
  int local_70;
  undefined1 local_69 [33];
  ulong local_48;
  int local_40;
  undefined1 local_29;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_10;
  
  local_10 = in_RSI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(in_RSI);
  puVar6 = &local_29;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1660a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x1660ce);
  local_40 = 1;
  local_48 = 0;
  while( true ) {
    uVar7 = local_48;
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(local_10);
    if (sVar2 <= uVar7) break;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[](&local_28,local_48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              (local_10,local_48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
              (local_10,local_48);
    AddRange(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (int)in_stack_ffffffffffffff68,(int)((ulong)puVar6 >> 0x20));
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&local_28,local_48);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    local_40 = local_40 * (int)sVar2;
    local_48 = local_48 + 1;
  }
  sVar2 = (size_type)local_40;
  local_69._1_8_ = 0;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16622e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,sVar2,(value_type_conflict1 *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x16625c);
  local_70 = 0;
  do {
    if (local_40 <= local_70) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20)
      ;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffff20);
      return;
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x166285);
    in_stack_ffffffffffffff20 = (allocator_type *)0x0;
    while( true ) {
      __n_00 = in_stack_ffffffffffffff20;
      paVar4 = (allocator_type *)
               std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::size(&local_28);
      if (paVar4 <= in_stack_ffffffffffffff20) break;
      in_stack_ffffffffffffff18 =
           (allocator_type *)
           std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&local_28,(size_type)__n_00);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_69 + 9),
                          (size_type)__n_00);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18,*pvVar5);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                 (value_type *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff20 = __n_00 + 1;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)in_stack_ffffffffffffff20,(value_type *)in_stack_ffffffffffffff18);
    uVar7 = 0;
    while( true ) {
      __n = uVar7;
      sVar2 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(&local_28);
      if (sVar2 <= uVar7) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_69 + 9),
                          __n);
      vVar1 = *pvVar5;
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&local_28,__n);
      sVar2 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
      if (vVar1 + 1 < sVar2) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_69 + 9),
                            __n);
        *pvVar5 = *pvVar5 + 1;
        break;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_69 + 9),
                          __n);
      *pvVar5 = 0;
      uVar7 = __n + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void BenchmarkImp::Ranges(const std::vector<std::pair<int, int>>& ranges) {
  std::vector<std::vector<int>> arglists(ranges.size());
  int total = 1;
  for (std::size_t i = 0; i < ranges.size(); i++) {
    AddRange(&arglists[i], ranges[i].first, ranges[i].second, range_multiplier_);
    total *= arglists[i].size();
  }

  std::vector<std::size_t> ctr(total, 0);

  for (int i = 0; i < total; i++) {
    std::vector<int> tmp;

    for (std::size_t j = 0; j < arglists.size(); j++) {
      tmp.push_back(arglists[j][ctr[j]]);
    }

    args_.push_back(tmp);

    for (std::size_t j = 0; j < arglists.size(); j++) {
      if (ctr[j] + 1 < arglists[j].size()) {
        ++ctr[j];
        break;
      }
      ctr[j] = 0;
    }
  }
}